

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

bool __thiscall mkvmuxer::Tag::ExpandSimpleTagsArray(Tag *this)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  void *pvVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  long *in_RDI;
  int idx;
  SimpleTag *simple_tags;
  int size;
  void *local_50;
  int local_44;
  int local_38;
  bool local_1;
  
  if (*(int *)((long)in_RDI + 0xc) < (int)in_RDI[1]) {
    local_1 = true;
  }
  else {
    if ((int)in_RDI[1] == 0) {
      local_44 = 1;
    }
    else {
      local_44 = (int)in_RDI[1] << 1;
    }
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)local_44;
    uVar2 = SUB168(auVar1 * ZEXT816(0x10),0);
    if (SUB168(auVar1 * ZEXT816(0x10),8) != 0) {
      uVar2 = 0xffffffffffffffff;
    }
    pvVar3 = operator_new__(uVar2,(nothrow_t *)&std::nothrow);
    local_50 = (void *)0x0;
    if (pvVar3 != (void *)0x0) {
      local_50 = pvVar3;
    }
    if (local_50 == (void *)0x0) {
      local_1 = false;
    }
    else {
      for (local_38 = 0; local_38 < *(int *)((long)in_RDI + 0xc); local_38 = local_38 + 1) {
        puVar5 = (undefined8 *)(*in_RDI + (long)local_38 * 0x10);
        puVar4 = (undefined8 *)((long)local_50 + (long)local_38 * 0x10);
        *puVar4 = *puVar5;
        puVar4[1] = puVar5[1];
      }
      if ((void *)*in_RDI != (void *)0x0) {
        operator_delete__((void *)*in_RDI);
      }
      *in_RDI = (long)local_50;
      *(int *)(in_RDI + 1) = local_44;
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool Tag::ExpandSimpleTagsArray() {
  if (simple_tags_size_ > simple_tags_count_)
    return true;  // nothing to do yet

  const int size = (simple_tags_size_ == 0) ? 1 : 2 * simple_tags_size_;

  SimpleTag* const simple_tags = new (std::nothrow) SimpleTag[size];  // NOLINT
  if (simple_tags == NULL)
    return false;

  for (int idx = 0; idx < simple_tags_count_; ++idx) {
    simple_tags[idx] = simple_tags_[idx];  // shallow copy
  }

  delete[] simple_tags_;

  simple_tags_ = simple_tags;
  simple_tags_size_ = size;

  return true;
}